

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

State * __thiscall re2::DFA::WorkqToCachedState(DFA *this,Workq *q,uint flag)

{
  Inst *this_00;
  int iVar1;
  bool bVar2;
  bool bVar3;
  EmptyOp EVar4;
  uint uVar5;
  int *inst;
  MatchKind MVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  int *piVar10;
  byte bVar11;
  ulong uVar12;
  int *piVar13;
  int ninst;
  ulong uVar14;
  State *pSStack_60;
  EmptyOp local_50;
  
  lVar7 = (long)q->maxmark_ + (long)q->n_;
  uVar12 = 0xffffffffffffffff;
  if (-1 < (int)lVar7) {
    uVar12 = lVar7 * 4;
  }
  inst = (int *)operator_new__(uVar12);
  piVar13 = (q->super_SparseSet).dense_;
  uVar9 = flag & 0x1000;
  bVar11 = 0;
  bVar3 = false;
  local_50 = 0;
  piVar10 = piVar13;
  uVar12 = 0;
  do {
    ninst = (int)uVar12;
    if (piVar10 == piVar13 + (q->super_SparseSet).size_) {
      iVar8 = q->n_;
LAB_0012b057:
      if (iVar8 + q->maxmark_ < ninst) {
        __assert_fail("(n) <= (q->size())",
                      "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc",
                      0x295,"DFA::State *re2::DFA::WorkqToCachedState(Workq *, uint)");
      }
      if (0 < ninst) {
        ninst = ninst - (uint)(inst[uVar12 - 1] == -1);
      }
      if (local_50 == 0) {
        flag = uVar9;
      }
      if (ninst == 0 && flag == 0) {
        pSStack_60 = (State *)0x1;
      }
      else {
        if (this->kind_ == kLongestMatch) {
          piVar13 = inst;
          while (piVar10 = piVar13, piVar13 < inst + ninst) {
            for (; piVar10 < inst + ninst; piVar10 = piVar10 + 1) {
              lVar7 = 4;
              if (*piVar10 == -1) goto LAB_0012b0c5;
            }
            lVar7 = 0;
LAB_0012b0c5:
            std::__sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(piVar13,piVar10);
            piVar13 = (int *)(lVar7 + (long)piVar10);
          }
        }
        pSStack_60 = CachedState(this,inst,ninst,flag | local_50 << 0x10);
      }
LAB_0012b103:
      operator_delete__(inst);
      return pSStack_60;
    }
    iVar1 = *piVar10;
    if ((bVar11 & 1) == 0) {
      iVar8 = q->n_;
    }
    else {
      iVar8 = q->n_;
      if ((this->kind_ == kFirstMatch) || (iVar8 <= iVar1)) goto LAB_0012b057;
    }
    if (iVar1 < iVar8) {
      this_00 = this->prog_->inst_ + iVar1;
      if (((this_00->out_opcode_ & 7) == 1) && (MVar6 = this->kind_, MVar6 != kManyMatch)) {
        if (MVar6 == kFirstMatch) {
          if ((piVar10 != piVar13) || (bVar2 = Prog::Inst::greedy(this_00,this->prog_), !bVar2))
          goto LAB_0012afef;
          MVar6 = this->kind_;
        }
        if (MVar6 == kLongestMatch) {
          if (uVar9 != 0 && !bVar3) {
LAB_0012b11a:
            pSStack_60 = (State *)0x2;
            goto LAB_0012b103;
          }
        }
        else if (uVar9 != 0) goto LAB_0012b11a;
      }
LAB_0012afef:
      if ((this->prog_->inst_[(long)iVar1 + -1].out_opcode_ & 8) != 0) {
        uVar12 = (ulong)(ninst + 1);
        inst[ninst] = *piVar10;
      }
      uVar5 = this_00->out_opcode_;
      if ((uVar5 & 7) == 4) {
        EVar4 = Prog::Inst::empty(this_00);
        local_50 = local_50 | EVar4;
        uVar5 = this_00->out_opcode_;
      }
      uVar14 = uVar12;
      if ((uVar5 & 7) == 5) {
        bVar11 = bVar11 | this->prog_->anchor_end_ ^ 1U;
      }
    }
    else {
      uVar14 = uVar12;
      if ((0 < ninst) && (inst[uVar12 - 1] != -1)) {
        uVar14 = (ulong)(ninst + 1);
        inst[uVar12] = -1;
        bVar3 = true;
      }
    }
    piVar10 = piVar10 + 1;
    piVar13 = (q->super_SparseSet).dense_;
    uVar12 = uVar14;
  } while( true );
}

Assistant:

DFA::State* DFA::WorkqToCachedState(Workq* q, uint flag) {
  if (DEBUG_MODE)
    mutex_.AssertHeld();

  // Construct array of instruction ids for the new state.
  // Only ByteRange, EmptyWidth, and Match instructions are useful to keep:
  // those are the only operators with any effect in
  // RunWorkqOnEmptyString or RunWorkqOnByte.
  int* inst = new int[q->size()];
  int n = 0;
  uint needflags = 0;     // flags needed by kInstEmptyWidth instructions
  bool sawmatch = false;  // whether queue contains guaranteed kInstMatch
  bool sawmark = false;  // whether queue contains a Mark
  if (DebugDFA)
    fprintf(stderr, "WorkqToCachedState %s [%#x]", DumpWorkq(q).c_str(), flag);
  for (Workq::iterator it = q->begin(); it != q->end(); ++it) {
    int id = *it;
    if (sawmatch && (kind_ == Prog::kFirstMatch || q->is_mark(id)))
      break;
    if (q->is_mark(id)) {
      if (n > 0 && inst[n-1] != Mark) {
        sawmark = true;
        inst[n++] = Mark;
      }
      continue;
    }
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
      case kInstAltMatch:
        // This state will continue to a match no matter what
        // the rest of the input is.  If it is the highest priority match
        // being considered, return the special FullMatchState
        // to indicate that it's all matches from here out.
        if (kind_ != Prog::kManyMatch &&
            (kind_ != Prog::kFirstMatch ||
             (it == q->begin() && ip->greedy(prog_))) &&
            (kind_ != Prog::kLongestMatch || !sawmark) &&
            (flag & kFlagMatch)) {
          delete[] inst;
          if (DebugDFA)
            fprintf(stderr, " -> FullMatchState\n");
          return FullMatchState;
        }
        // Fall through.
      default:
        // Record iff id is the head of its list, which must
        // be the case if id-1 is the last of *its* list. :)
        if (prog_->inst(id-1)->last())
          inst[n++] = *it;
        if (ip->opcode() == kInstEmptyWidth)
          needflags |= ip->empty();
        if (ip->opcode() == kInstMatch && !prog_->anchor_end())
          sawmatch = true;
        break;
    }
  }
  DCHECK_LE(n, q->size());
  if (n > 0 && inst[n-1] == Mark)
    n--;

  // If there are no empty-width instructions waiting to execute,
  // then the extra flag bits will not be used, so there is no
  // point in saving them.  (Discarding them reduces the number
  // of distinct states.)
  if (needflags == 0)
    flag &= kFlagMatch;

  // NOTE(rsc): The code above cannot do flag &= needflags,
  // because if the right flags were present to pass the current
  // kInstEmptyWidth instructions, new kInstEmptyWidth instructions
  // might be reached that in turn need different flags.
  // The only sure thing is that if there are no kInstEmptyWidth
  // instructions at all, no flags will be needed.
  // We could do the extra work to figure out the full set of
  // possibly needed flags by exploring past the kInstEmptyWidth
  // instructions, but the check above -- are any flags needed
  // at all? -- handles the most common case.  More fine-grained
  // analysis can only be justified by measurements showing that
  // too many redundant states are being allocated.

  // If there are no Insts in the list, it's a dead state,
  // which is useful to signal with a special pointer so that
  // the execution loop can stop early.  This is only okay
  // if the state is *not* a matching state.
  if (n == 0 && flag == 0) {
    delete[] inst;
    if (DebugDFA)
      fprintf(stderr, " -> DeadState\n");
    return DeadState;
  }

  // If we're in longest match mode, the state is a sequence of
  // unordered state sets separated by Marks.  Sort each set
  // to canonicalize, to reduce the number of distinct sets stored.
  if (kind_ == Prog::kLongestMatch) {
    int* ip = inst;
    int* ep = ip + n;
    while (ip < ep) {
      int* markp = ip;
      while (markp < ep && *markp != Mark)
        markp++;
      sort(ip, markp);
      if (markp < ep)
        markp++;
      ip = markp;
    }
  }

  // Save the needed empty-width flags in the top bits for use later.
  flag |= needflags << kFlagNeedShift;

  State* state = CachedState(inst, n, flag);
  delete[] inst;
  return state;
}